

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure_member.cpp
# Opt level: O1

void __thiscall
r_comp::StructureMember::StructureMember
          (StructureMember *this,_Read r,string *m,string *p,Iteration i)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  code *pcVar5;
  long lVar6;
  undefined8 uVar7;
  ReturnType RVar8;
  undefined4 in_register_00000084;
  Iteration in_R9D;
  
  this->_read = r;
  *(string **)&this->field_0x8 = m;
  paVar1 = &(this->_class).field_2;
  (this->_class)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(CONCAT44(in_register_00000084,i) + 0x10);
  if (*(size_type **)CONCAT44(in_register_00000084,i) == psVar2) {
    uVar7 = *(undefined8 *)(CONCAT44(in_register_00000084,i) + 0x18);
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->_class).field_2 + 8) = uVar7;
  }
  else {
    (this->_class)._M_dataplus._M_p = (pointer)*(size_type **)CONCAT44(in_register_00000084,i);
    (this->_class).field_2._M_allocated_capacity = *psVar2;
  }
  (this->_class)._M_string_length = *(size_type *)(CONCAT44(in_register_00000084,i) + 8);
  *(size_type **)CONCAT44(in_register_00000084,i) = psVar2;
  *(undefined8 *)(CONCAT44(in_register_00000084,i) + 8) = 0;
  *(undefined1 *)(CONCAT44(in_register_00000084,i) + 0x10) = 0;
  this->iteration = in_R9D;
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (p->_M_dataplus)._M_p;
  paVar3 = &p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar3) {
    uVar7 = *(undefined8 *)((long)&p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar3->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar7;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar4;
    (this->name).field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  (this->name)._M_string_length = p->_M_string_length;
  (p->_M_dataplus)._M_p = (pointer)paVar3;
  p->_M_string_length = 0;
  (p->field_2)._M_local_buf[0] = '\0';
  pcVar5 = (code *)this->_read;
  lVar6 = *(long *)&this->field_0x8;
  RVar8 = ANY;
  if ((((((pcVar5 == Compiler::read_any && lVar6 == 0) ||
         (RVar8 = NUMBER, pcVar5 == Compiler::read_number && lVar6 == 0)) ||
        (RVar8 = TIMESTAMP, pcVar5 == Compiler::read_timestamp && lVar6 == 0)) ||
       ((RVar8 = BOOLEAN, pcVar5 == Compiler::read_boolean && lVar6 == 0 ||
        (RVar8 = STRING, pcVar5 == Compiler::read_string && lVar6 == 0)))) ||
      ((RVar8 = NODE_ID, pcVar5 == Compiler::read_node && lVar6 == 0 ||
       ((RVar8 = DEVICE_ID, pcVar5 == Compiler::read_device && lVar6 == 0 ||
        (RVar8 = FUNCTION_ID, pcVar5 == Compiler::read_function && lVar6 == 0)))))) ||
     ((RVar8 = ANY, pcVar5 == Compiler::read_expression && lVar6 == 0 ||
      ((RVar8 = SET, pcVar5 == Compiler::read_set && lVar6 == 0 ||
       (RVar8 = CLASS, pcVar5 == Compiler::read_class && lVar6 == 0)))))) {
    this->type = RVar8;
  }
  return;
}

Assistant:

StructureMember::StructureMember(_Read r,
                                 std::string m,
                                 std::string p,
                                 Iteration i): _read(r),
    _class(std::move(p)),
    iteration(i),
    name(std::move(m))
{
    if (_read == &Compiler::read_any) {
        type = ANY;
    } else if (_read == &Compiler::read_number) {
        type = NUMBER;
    } else if (_read == &Compiler::read_timestamp) {
        type = TIMESTAMP;
    } else if (_read == &Compiler::read_boolean) {
        type = BOOLEAN;
    } else if (_read == &Compiler::read_string) {
        type = STRING;
    } else if (_read == &Compiler::read_node) {
        type = NODE_ID;
    } else if (_read == &Compiler::read_device) {
        type = DEVICE_ID;
    } else if (_read == &Compiler::read_function) {
        type = FUNCTION_ID;
    } else if (_read == &Compiler::read_expression) {
        type = ANY;
    } else if (_read == &Compiler::read_set) {
        type = ReturnType::SET;
    } else if (_read == &Compiler::read_class) {
        type = ReturnType::CLASS;
    }
}